

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint * ecc_weierstrass_double(WeierstrassPoint *P)

{
  mp_int *local_30;
  mp_int *lambda_d;
  mp_int *lambda_n;
  WeierstrassPoint *D;
  WeierstrassCurve *wc;
  WeierstrassPoint *P_local;
  
  D = (WeierstrassPoint *)P->wc;
  wc = (WeierstrassCurve *)P;
  lambda_n = (mp_int *)ecc_weierstrass_point_new_empty((WeierstrassCurve *)D);
  ecc_weierstrass_tangent_slope((WeierstrassPoint *)wc,&lambda_d,&local_30);
  ecc_weierstrass_epilogue
            (wc->p,wc->p,(mp_int *)wc->mc,(mp_int *)wc->sc,lambda_d,local_30,
             (WeierstrassPoint *)lambda_n);
  mp_free(lambda_d);
  mp_free(local_30);
  return (WeierstrassPoint *)lambda_n;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_double(WeierstrassPoint *P)
{
    WeierstrassCurve *wc = P->wc;
    WeierstrassPoint *D = ecc_weierstrass_point_new_empty(wc);

    mp_int *lambda_n, *lambda_d;
    ecc_weierstrass_tangent_slope(P, &lambda_n, &lambda_d);
    ecc_weierstrass_epilogue(P->X, P->X, P->Y, P->Z, lambda_n, lambda_d, D);
    mp_free(lambda_n);
    mp_free(lambda_d);

    return D;
}